

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O0

void __thiscall
spvtools::opt::LoopDependenceAnalysis::LoopDependenceAnalysis
          (LoopDependenceAnalysis *this,IRContext *context,
          vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *loops)

{
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *loops_local;
  IRContext *context_local;
  LoopDependenceAnalysis *this_local;
  
  this->context_ = context;
  std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
            (&this->loops_,loops);
  ScalarEvolutionAnalysis::ScalarEvolutionAnalysis(&this->scalar_evolution_,context);
  this->debug_stream_ = (ostream *)0x0;
  memset(&this->constraints_,0,0x18);
  std::__cxx11::
  list<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ::list(&this->constraints_);
  return;
}

Assistant:

LoopDependenceAnalysis(IRContext* context, std::vector<const Loop*> loops)
      : context_(context),
        loops_(loops),
        scalar_evolution_(context),
        debug_stream_(nullptr),
        constraints_{} {}